

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

void Gia_RsbUpdateAdd(Gia_RsbMan_t *p,int iObj)

{
  uint Entry;
  int iVar1;
  Vec_Int_t *pVVar2;
  bool bVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  bool bVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  
  pVVar5 = p->vObjs;
  bVar7 = (byte)pVVar5->nSize;
  uVar4 = 1 << (bVar7 & 0x1f);
  if (p->vSets[0]->nSize != uVar4) {
    __assert_fail("Vec_WecSize(p->vSets[0]) == nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x563,"void Gia_RsbUpdateAdd(Gia_RsbMan_t *, int)");
  }
  if (p->vSets[1]->nSize != uVar4) {
    __assert_fail("Vec_WecSize(p->vSets[1]) == nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x564,"void Gia_RsbUpdateAdd(Gia_RsbMan_t *, int)");
  }
  if (pVVar5->nSize != 0x1f) {
    uVar8 = 1;
    if (1 < (int)uVar4) {
      uVar8 = (ulong)uVar4;
    }
    uVar12 = 0;
    do {
      lVar10 = 0;
      bVar3 = true;
      do {
        bVar9 = bVar3;
        pVVar5 = Vec_WecPushLevel(p->vSets[lVar10]);
        if ((long)p->vSets[lVar10]->nSize <= (long)uVar12) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        pVVar2 = p->vSets[lVar10]->pArray;
        uVar4 = pVVar2[uVar12].nSize;
        uVar6 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar11 = 0;
        }
        else {
          lVar10 = 0;
          uVar11 = 0;
          do {
            uVar4 = p->nWords * iObj;
            if (((int)uVar4 < 0) || (p->vSims->nSize <= (int)uVar4)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                            ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
            }
            Entry = pVVar2[uVar12].pArray[lVar10];
            if ((p->vSims->pArray[(ulong)uVar4 + (long)((int)Entry >> 6)] >> ((ulong)Entry & 0x3f) &
                1) == 0) {
              if (((int)uVar11 < 0) || ((uint)uVar6 <= uVar11)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              uVar6 = (ulong)uVar11;
              uVar11 = uVar11 + 1;
              pVVar2[uVar12].pArray[uVar6] = Entry;
            }
            else {
              Vec_IntPush(pVVar5,Entry);
            }
            lVar10 = lVar10 + 1;
            uVar4 = pVVar2[uVar12].nSize;
            uVar6 = (ulong)(int)uVar4;
          } while (lVar10 < (long)uVar6);
        }
        if ((int)uVar4 < (int)uVar11) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        pVVar2[uVar12].nSize = uVar11;
        lVar10 = 1;
        bVar3 = false;
      } while (bVar9);
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar8);
    pVVar5 = p->vObjs;
  }
  Vec_IntPush(pVVar5,iObj);
  iVar1 = p->vSets[0]->nSize;
  if (iVar1 != 2 << (bVar7 & 0x1f)) {
    __assert_fail("Vec_WecSize(p->vSets[0]) == 2*nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x577,"void Gia_RsbUpdateAdd(Gia_RsbMan_t *, int)");
  }
  if (p->vSets[1]->nSize != iVar1) {
    __assert_fail("Vec_WecSize(p->vSets[1]) == 2*nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x578,"void Gia_RsbUpdateAdd(Gia_RsbMan_t *, int)");
  }
  return;
}

Assistant:

void Gia_RsbUpdateAdd( Gia_RsbMan_t * p, int iObj )
{
    int n, i, nLeaves = 1 << Vec_IntSize(p->vObjs);
    assert( Vec_WecSize(p->vSets[0]) == nLeaves );
    assert( Vec_WecSize(p->vSets[1]) == nLeaves );
    for ( i = 0; i < nLeaves; i++ )
    {
        for ( n = 0; n < 2; n++ )
        {
            Vec_Int_t * vLevelN = Vec_WecPushLevel(p->vSets[n]);  
            Vec_Int_t * vLevel  = Vec_WecEntry(p->vSets[n], i);
            int iMint, j, k = 0;
            Vec_IntForEachEntry( vLevel, iMint, j )
            {
                if ( Abc_TtGetBit(Vec_WrdEntryP(p->vSims, p->nWords*iObj), iMint) )
                    Vec_IntPush( vLevelN, iMint );
                else
                    Vec_IntWriteEntry( vLevel, k++, iMint );
            }
            Vec_IntShrink( vLevel, k );
        }
    }
    Vec_IntPush( p->vObjs, iObj );
    assert( Vec_WecSize(p->vSets[0]) == 2*nLeaves );
    assert( Vec_WecSize(p->vSets[1]) == 2*nLeaves );
}